

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_protect.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ad1ec::mock_region_factory::add
          (mock_region_factory *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t original_size,uint64_t new_size)

{
  shared_ptr<pstore::file::in_memory> local_38;
  uint64_t local_28;
  uint64_t new_size_local;
  uint64_t original_size_local;
  mock_region_factory *this_local;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  regions_local;
  
  local_28 = new_size;
  new_size_local = original_size;
  original_size_local = (uint64_t)this;
  this_local = (mock_region_factory *)regions.ptr_;
  std::shared_ptr<pstore::file::in_memory>::shared_ptr(&local_38,&this->file_);
  pstore::region::factory::append<pstore::file::in_memory,(anonymous_namespace)::mock_mapper>
            (&this->super_factory,&local_38,
             (not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
              )this_local,new_size_local,local_28);
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr(&local_38);
  return;
}

Assistant:

void add (pstore::gsl::not_null<std::vector<pstore::region::memory_mapper_ptr> *> regions,
                  std::uint64_t original_size, std::uint64_t new_size) override {
            this->append<pstore::file::in_memory, mock_mapper> (file_, regions, original_size,
                                                                new_size);
        }